

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# censor1.c
# Opt level: O2

int ssh1_censor_packet(PacketLogSettings *pls,int type,_Bool sender_is_client,ptrlen pkt,
                      logblank_t *blanks)

{
  BinarySource *pBVar1;
  uint uVar2;
  ptrlen pVar3;
  BinarySource src [1];
  
  src[0].len = pkt.len;
  src[0].data = pkt.ptr;
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  uVar2 = 0;
  pBVar1 = src;
  if (pls->omit_data == true) {
    pBVar1 = src;
    if (2 < type - 0x10U) {
      pBVar1 = src;
      if (type != 0x17) goto LAB_0011d4be;
      BinarySource_get_uint32(src);
      pBVar1 = src[0].binarysource_;
    }
    src[0].binarysource_ = pBVar1;
    pVar3 = BinarySource_get_string(src[0].binarysource_);
    pBVar1 = src[0].binarysource_;
    if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
      blanks->offset = (int)src[0].pos - (int)pVar3.len;
      blanks->type = 2;
      blanks->len = (int)pVar3.len;
      uVar2 = 1;
    }
  }
LAB_0011d4be:
  src[0].binarysource_ = pBVar1;
  if (!sender_is_client) {
    return uVar2;
  }
  if (pls->omit_passwords != true) {
    return uVar2;
  }
  if (type != 9) {
    if (type == 0x22) {
      BinarySource_get_string(src[0].binarysource_);
      pVar3 = BinarySource_get_string(src[0].binarysource_);
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        return uVar2;
      }
      blanks[uVar2].offset = (int)src[0].pos - (int)pVar3.len;
      blanks[uVar2].type = 1;
      blanks[uVar2].len = (int)pVar3.len;
      goto LAB_0011d4f9;
    }
    if ((type != 0x48) && (type != 0x29)) {
      return uVar2;
    }
  }
  blanks[uVar2].offset = 0;
  blanks[uVar2].len = (int)pkt.len;
  blanks[uVar2].type = 1;
LAB_0011d4f9:
  return uVar2 + 1;
}

Assistant:

int ssh1_censor_packet(
    const PacketLogSettings *pls, int type, bool sender_is_client,
    ptrlen pkt, logblank_t *blanks)
{
    int nblanks = 0;
    ptrlen str;
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, pkt);

    if (pls->omit_data &&
        (type == SSH1_SMSG_STDOUT_DATA ||
         type == SSH1_SMSG_STDERR_DATA ||
         type == SSH1_CMSG_STDIN_DATA ||
         type == SSH1_MSG_CHANNEL_DATA)) {
        /* "Session data" packets - omit the data string. */
        if (type == SSH1_MSG_CHANNEL_DATA)
            get_uint32(src);           /* skip channel id */
        str = get_string(src);
        if (!get_err(src)) {
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos - str.len;
            blanks[nblanks].type = PKTLOG_OMIT;
            blanks[nblanks].len = str.len;
            nblanks++;
        }
    }

    if (sender_is_client && pls->omit_passwords) {
        if (type == SSH1_CMSG_AUTH_PASSWORD ||
            type == SSH1_CMSG_AUTH_TIS_RESPONSE ||
            type == SSH1_CMSG_AUTH_CCARD_RESPONSE) {
            /* If this is a password or similar packet, blank the
             * password(s). */
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = 0;
            blanks[nblanks].len = pkt.len;
            blanks[nblanks].type = PKTLOG_BLANK;
            nblanks++;
        } else if (type == SSH1_CMSG_X11_REQUEST_FORWARDING) {
            /*
             * If this is an X forwarding request packet, blank the
             * fake auth data.
             *
             * Note that while we blank the X authentication data
             * here, we don't take any special action to blank the
             * start of an X11 channel, so using MIT-MAGIC-COOKIE-1
             * and actually opening an X connection without having
             * session blanking enabled is likely to leak your cookie
             * into the log.
             */
            get_string(src);              /* skip protocol name */
            str = get_string(src);
            if (!get_err(src)) {
                assert(nblanks < MAX_BLANKS);
                blanks[nblanks].offset = src->pos - str.len;
                blanks[nblanks].type = PKTLOG_BLANK;
                blanks[nblanks].len = str.len;
                nblanks++;
            }
        }
    }

    return nblanks;
}